

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

exr_result_t
exr_encoding_update(exr_const_context_t_conflict ctxt,int part_index,exr_chunk_info_t *cinfo,
                   exr_encode_pipeline_t *encode)

{
  long in_RCX;
  void *in_RDX;
  uint in_ESI;
  exr_const_context_t in_RDI;
  exr_const_priv_part_t part;
  exr_coding_channel_info_t *in_stack_00000008;
  exr_result_t rv;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar1;
  
  if (in_RDI == (exr_const_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    if (in_RDI->mode == '\x01') {
      internal_exr_lock((exr_const_context_t_conflict)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    }
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      if (in_RDI->mode == '\x01') {
        internal_exr_unlock((exr_const_context_t_conflict)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      }
      eVar1 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else if ((in_RDX == (void *)0x0) || (in_RCX == 0)) {
      if (in_RDI->mode == '\x01') {
        internal_exr_unlock((exr_const_context_t_conflict)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      }
      eVar1 = (*in_RDI->standard_error)(in_RDI,3);
    }
    else if ((*(exr_const_context_t *)(in_RCX + 0x18) == in_RDI) &&
            (*(uint *)(in_RCX + 0x14) == in_ESI)) {
      if (*(long *)(in_RCX + 0x68) == *(long *)(in_RCX + 0xa8)) {
        *(undefined8 *)(in_RCX + 0xa8) = 0;
      }
      *(undefined8 *)(in_RCX + 0x70) = 0;
      *(undefined8 *)(in_RCX + 0x98) = 0;
      *(undefined8 *)(in_RCX + 0xb0) = 0;
      eVar1 = internal_coding_update_channel_info
                        (in_stack_00000008,part._6_2_,
                         (exr_chunk_info_t *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                         (exr_const_priv_part_t)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
      if (eVar1 == 0) {
        memcpy((void *)(in_RCX + 0x20),in_RDX,0x40);
      }
      if (in_RDI->mode == '\x01') {
        internal_exr_unlock((exr_const_context_t_conflict)CONCAT44(eVar1,in_stack_ffffffffffffffd0))
        ;
      }
    }
    else {
      if (in_RDI->mode == '\x01') {
        internal_exr_unlock((exr_const_context_t_conflict)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      }
      eVar1 = (*in_RDI->print_error)
                        (in_RDI,3,
                         "Cross-wired request for default routines from different context / part");
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_encoding_update (
    exr_const_context_t     ctxt,
    int                     part_index,
    const exr_chunk_info_t* cinfo,
    exr_encode_pipeline_t*  encode)
{
    exr_result_t rv;

    EXR_LOCK_WRITE_AND_DEFINE_PART (part_index);
    if (!cinfo || !encode)
        return EXR_UNLOCK_WRITE_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT));

    if (encode->context != ctxt || encode->part_index != part_index)
        return EXR_UNLOCK_WRITE_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Cross-wired request for default routines from different context / part"));

    if (encode->packed_buffer == encode->compressed_buffer)
        encode->compressed_buffer = NULL;

    encode->packed_bytes              = 0;
    encode->packed_sample_count_bytes = 0;
    encode->compressed_bytes          = 0;

    rv = internal_coding_update_channel_info (
        encode->channels, encode->channel_count, cinfo, ctxt, part);

    if (rv == EXR_ERR_SUCCESS) encode->chunk = *cinfo;
    return EXR_UNLOCK_WRITE_AND_RETURN (rv);
}